

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O1

int splittingStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  ARKodeSplittingStepMem step_mem;
  SplittingStepCoefficients pSVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  step_mem = (ARKodeSplittingStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeSplittingStepMem)0x0) {
    iVar2 = -0x15;
    arkProcessError(ark_mem,-0x15,0x20,"splittingStep_TakeStep",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    *nflagPtr = 0;
    *dsmPtr = 0.0;
    pSVar1 = step_mem->coefficients;
    N_VScale(0x3ff0000000000000,ark_mem->yn,ark_mem->ycur);
    iVar2 = splittingStep_SequentialMethod(ark_mem,step_mem,0,ark_mem->ycur);
    if (iVar2 == 0) {
      if ((*pSVar1->alpha != 1.0) || (NAN(*pSVar1->alpha))) {
        N_VScale(ark_mem->ycur,ark_mem->ycur);
      }
      iVar2 = 0;
      if (1 < pSVar1->sequential_methods) {
        lVar4 = 1;
        do {
          N_VScale(0x3ff0000000000000,ark_mem->yn,ark_mem->tempv1);
          iVar3 = splittingStep_SequentialMethod(ark_mem,step_mem,(int)lVar4,ark_mem->tempv1);
          if (iVar3 != 0) {
            return iVar3;
          }
          N_VLinearSum(0x3ff0000000000000,pSVar1->alpha[lVar4],ark_mem->ycur,ark_mem->tempv1,
                       ark_mem->ycur);
          lVar4 = lVar4 + 1;
        } while (lVar4 < pSVar1->sequential_methods);
      }
    }
  }
  return iVar2;
}

Assistant:

static int splittingStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                  int* nflagPtr)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  *nflagPtr = ARK_SUCCESS; /* No algebraic solver */
  *dsmPtr   = ZERO;        /* No error estimate */

  SplittingStepCoefficients coefficients = step_mem->coefficients;

  SUNLogInfo(ARK_LOGGER, "begin-sequential-method", "sequential method = 0");

  N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
  retval = splittingStep_SequentialMethod(ark_mem, step_mem, 0, ark_mem->ycur);
  SUNLogExtraDebugVec(ARK_LOGGER, "sequential state", ark_mem->ycur,
                      "y_seq(:) =");
  if (retval != ARK_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-sequential-method",
               "status = failed sequential method, retval = %i", retval);
    return retval;
  }

  if (coefficients->alpha[0] != ONE)
  {
    N_VScale(coefficients->alpha[0], ark_mem->ycur, ark_mem->ycur);
  }
  SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");
  SUNLogInfo(ARK_LOGGER, "end-sequential-method", "status = success");

  for (int i = 1; i < coefficients->sequential_methods; i++)
  {
    SUNLogInfo(ARK_LOGGER, "begin-sequential-method", "sequential method = %i",
               i);

    N_VScale(ONE, ark_mem->yn, ark_mem->tempv1);
    retval = splittingStep_SequentialMethod(ark_mem, step_mem, i,
                                            ark_mem->tempv1);
    SUNLogExtraDebugVec(ARK_LOGGER, "sequential state", ark_mem->tempv1,
                        "y_seq(:) =");
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-sequential-method",
                 "status = failed sequential method, retval = %i", retval);
      return retval;
    }
    N_VLinearSum(ONE, ark_mem->ycur, coefficients->alpha[i], ark_mem->tempv1,
                 ark_mem->ycur);

    SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");
    SUNLogInfo(ARK_LOGGER, "end-sequential-method", "status = success");
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");

  return ARK_SUCCESS;
}